

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_test.cc
# Opt level: O3

void __thiscall
(anonymous_namespace)::SADSkipx4Test_MaxSrc_Test::TestBody(SADSkipx4Test_MaxSrc_Test *this)

{
  anon_unknown.dwarf_259311b::SADSkipx4Test_MaxSrc_Test::TestBody
            ((SADSkipx4Test_MaxSrc_Test *)(this + -8));
  return;
}

Assistant:

TEST_P(SADSkipx4Test, MaxSrc) {
  FillConstant(source_data_, source_stride_, mask_);
  FillConstant(GetReference(0), reference_stride_, 0);
  FillConstant(GetReference(1), reference_stride_, 0);
  FillConstant(GetReference(2), reference_stride_, 0);
  FillConstant(GetReference(3), reference_stride_, 0);
  CheckSADs();
}